

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int eval_relative_location_path
              (lyxp_expr *exp,uint16_t *exp_idx,lyd_node *cur_node,lys_module *param_4,int all_desc,
              lyxp_set *set,int options)

{
  byte bVar1;
  ushort uVar2;
  uint16_t uVar3;
  LYS_NODE LVar4;
  lyd_node *plVar5;
  ushort uVar6;
  lyxp_set_type lVar7;
  lys_module *plVar8;
  lyxp_set_nodes *plVar9;
  lys_module *plVar10;
  char *pcVar11;
  char *pcVar12;
  lyxp_set *set_00;
  lys_module *plVar13;
  lys_module *plVar14;
  LY_ERR *pLVar15;
  undefined4 uVar16;
  int iVar17;
  long lVar18;
  undefined8 uVar19;
  lyxp_node_type lVar20;
  int iVar21;
  int iVar22;
  lyxp_node_type *plVar23;
  lys_module *plVar24;
  ulong uVar25;
  uint uVar26;
  ulong uVar27;
  uint32_t idx;
  uint uVar28;
  ly_ctx *plVar29;
  lyd_attr *plVar30;
  ly_ctx *plVar31;
  bool bVar32;
  lyxp_node_type local_9c;
  lyxp_node_type local_98;
  lyxp_node_type local_94;
  char *local_90;
  lyxp_set *local_88;
  lys_module *local_80;
  lys_module *local_78;
  char *local_70;
  lys_module *local_68;
  ly_ctx *local_60;
  ly_ctx *local_58;
  lys_node *local_50;
  lys_module *local_48;
  lys_module *local_40;
  char local_31;
  
  local_90 = "parsed";
  if (set == (lyxp_set *)0x0) {
    local_90 = "skipped";
  }
  local_31 = (options & 0x1cU) == 0 || set == (lyxp_set *)0x0;
  local_78 = param_4;
  local_50 = (lys_node *)cur_node;
  do {
    switch(exp->tokens[*exp_idx]) {
    case LYXP_TOKEN_DOT:
      if (local_31 == '\0') {
        lVar7 = moveto_snode_self(set,local_50,all_desc,options);
      }
      else {
        lVar7 = moveto_self(set,(lyd_node *)local_50,all_desc,options);
      }
      goto switchD_0016c3cb_caseD_0;
    case LYXP_TOKEN_DDOT:
      if (local_31 != '\0') {
        lVar7 = LYXP_SET_EMPTY;
        if (set != (lyxp_set *)0x0) {
          lVar7 = set->type;
          pcVar11 = "schema node set";
          switch(lVar7) {
          case LYXP_SET_EMPTY:
            break;
          case LYXP_SET_NODE_SET:
            if ((all_desc == 0) ||
               (lVar7 = moveto_self(set,(lyd_node *)local_50,1,options), lVar7 == LYXP_SET_EMPTY)) {
              local_48 = (lys_module *)moveto_get_root((lyd_node *)local_50,options,&local_98);
              if (set->used != 0) {
                plVar10 = (lys_module *)0x0;
                local_58 = (ly_ctx *)CONCAT44(local_58._4_4_,local_98);
                plVar8 = plVar10;
                do {
                  while( true ) {
                    local_40 = plVar8;
                    plVar24 = local_40;
                    plVar9 = (set->val).nodes;
                    plVar8 = (lys_module *)plVar9[(long)local_40].node;
                    lVar20 = plVar9[(long)local_40].type;
                    idx = (uint32_t)plVar10;
                    if (lVar20 != LYXP_NODE_ATTR) break;
                    plVar9 = plVar9 + (long)local_40;
                    local_40 = (lys_module *)CONCAT44(local_40._4_4_,idx);
                    plVar14 = (lys_module *)
                              lyd_attr_parent((lyd_node *)local_48,(lyd_attr *)plVar9->node);
                    idx = (uint32_t)local_40;
                    if (plVar14 == (lys_module *)0x0) {
                      pLVar15 = ly_errno_location();
                      *pLVar15 = LY_EINT;
                      ly_log(LY_LLERR,"Internal error (%s:%d).",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                             ,0x14b8);
                      goto LAB_0016cdab;
                    }
LAB_0016c496:
                    if ((((options & 2U) != 0) && (plVar14 != (lys_module *)0x0)) &&
                       (((ulong)plVar14->name & 0xe00) == 0x800)) {
                      lVar7 = LYXP_SET_NODE_SET;
                      goto switchD_0016c3cb_caseD_0;
                    }
                    if (local_48 == plVar8) {
                      if ((options == 0) ||
                         (lVar20 = LYXP_NODE_ROOT_CONFIG, plVar14 = plVar8,
                         (((lys_node *)local_50->name)->flags & 1) == 0)) {
                        lVar20 = LYXP_NODE_ROOT;
                        plVar14 = plVar8;
                      }
                    }
                    else {
                      lVar20 = LYXP_NODE_ELEM;
                      if (plVar14 == (lys_module *)0x0) {
                        if ((options == 0) ||
                           (lVar20 = LYXP_NODE_ROOT_CONFIG,
                           (((lys_node *)local_50->name)->flags & 1) == 0)) {
                          lVar20 = LYXP_NODE_ROOT;
                        }
                        do {
                          plVar10 = plVar8;
                          plVar8 = (lys_module *)plVar10->ref;
                        } while ((lyd_node *)plVar8->dsc != (lyd_node *)0x0);
                        plVar14 = local_48;
                        if (plVar10 != local_48) {
                          local_40 = (lys_module *)CONCAT44(local_40._4_4_,idx);
                          pLVar15 = ly_errno_location();
                          *pLVar15 = LY_EINT;
                          ly_log(LY_LLERR,"Internal error (%s:%d).",
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                                 ,0x14d9);
                          plVar14 = local_48;
                          idx = (uint32_t)local_40;
                        }
                      }
                    }
                    if ((lVar20 != LYXP_NODE_ELEM) &&
                       ((lVar20 != (lyxp_node_type)local_58 || (plVar14 != local_48)))) {
                      __assert_fail("(new_type == LYXP_NODE_ELEM) || ((new_type == root_type) && (new_node == root))"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                                    ,0x14e3,
                                    "int moveto_parent(struct lyxp_set *, struct lyd_node *, int, int)"
                                   );
                    }
                    if ((ulong)set->used != 0) {
                      plVar23 = &((set->val).nodes)->type;
                      uVar27 = 0;
                      do {
                        if (((lys_module *)((lyxp_set_nodes *)(plVar23 + -2))->node == plVar14) &&
                           (*plVar23 == lVar20)) {
                          if (-1 < (int)uVar27) {
                            set_remove_node(set,idx);
                            goto LAB_0016c5b1;
                          }
                          break;
                        }
                        uVar27 = uVar27 + 1;
                        plVar23 = plVar23 + 4;
                      } while (set->used != uVar27);
                    }
                    (set->val).nodes[(long)plVar24].node = (lyd_node *)plVar14;
                    (set->val).nodes[(long)plVar24].type = lVar20;
                    (set->val).nodes[(long)plVar24].pos = 0;
                    idx = idx + 1;
LAB_0016c5b1:
                    plVar10 = (lys_module *)(ulong)idx;
                    plVar8 = plVar10;
                    if (set->used <= idx) goto LAB_0016cf0f;
                  }
                  plVar14 = plVar8;
                  if (lVar20 == LYXP_NODE_TEXT) goto LAB_0016c496;
                  if (lVar20 == LYXP_NODE_ELEM) {
                    plVar14 = (lys_module *)plVar8->org;
                    goto LAB_0016c496;
                  }
                  set_remove_node(set,idx);
                  plVar8 = local_40;
                } while (idx < set->used);
              }
LAB_0016cf0f:
              iVar17 = set_sort(set,(lyd_node *)local_50,options);
              if (1 < iVar17) {
                pLVar15 = ly_errno_location();
                *pLVar15 = LY_EINT;
                ly_log(LY_LLERR,"XPath set was expected to be sorted, but is not (%s).",
                       "moveto_parent");
              }
              lVar7 = LYXP_SET_EMPTY;
              if (1 < set->used) {
                bVar32 = false;
                uVar27 = 0;
                do {
                  plVar9 = (set->val).nodes;
                  uVar28 = (int)uVar27 + 1;
                  uVar25 = (ulong)uVar28;
                  if ((plVar9[uVar27].node == plVar9[uVar25].node) &&
                     (plVar9[uVar27].type == plVar9[uVar25].type)) {
                    set_remove_node(set,uVar28);
                    bVar32 = true;
                    uVar25 = uVar27;
                  }
                  uVar27 = uVar25;
                } while ((uint)uVar25 < set->used - 1);
                if (bVar32) {
                  pLVar15 = ly_errno_location();
                  *pLVar15 = LY_EINT;
                  ly_log(LY_LLERR,"XPath set includes duplicates (%s).","moveto_parent");
                }
                lVar7 = LYXP_SET_EMPTY;
              }
            }
            break;
          case LYXP_SET_SNODE_SET:
            goto switchD_0016c3cb_caseD_2;
          case LYXP_SET_BOOLEAN:
            goto switchD_0016c3cb_caseD_3;
          case LYXP_SET_NUMBER:
            goto switchD_0016c3cb_caseD_4;
          case LYXP_SET_STRING:
            goto switchD_0016c3cb_caseD_5;
          default:
            goto switchD_0016c3cb_default;
          }
        }
        goto switchD_0016c3cb_caseD_0;
      }
      lVar7 = set->type;
      pcVar11 = "node set";
      switch(lVar7) {
      case LYXP_SET_EMPTY:
        goto switchD_0016c3cb_caseD_0;
      case LYXP_SET_NODE_SET:
        break;
      case LYXP_SET_SNODE_SET:
        if ((all_desc == 0) ||
           (lVar7 = moveto_snode_self(set,local_50,1,options), lVar7 == LYXP_SET_EMPTY)) {
          local_48 = (lys_module *)moveto_snode_get_root(local_50,options,&local_94);
          plVar29 = (ly_ctx *)(long)(int)set->used;
          lVar7 = LYXP_SET_EMPTY;
          if ((long)plVar29 < 1) {
            bVar32 = false;
          }
          else {
            plVar31 = (ly_ctx *)0x0;
            local_60 = (ly_ctx *)((ulong)local_60 & 0xffffffff00000000);
            local_58 = plVar29;
            do {
              if ((set->val).nodes[(long)plVar31].pos == 1) {
                (set->val).nodes[(long)plVar31].pos = 0;
                if ((set->val).nodes[(long)plVar31].type == LYXP_NODE_ELEM) {
                  plVar8 = (lys_module *)(set->val).nodes[(long)plVar31].node;
                  local_40 = plVar8;
                  do {
                    plVar8 = (lys_module *)lys_parent((lys_node *)plVar8);
                    if (plVar8 == (lys_module *)0x0) break;
                  } while (((ulong)plVar8->filepath & 0x1642) != 0);
                  if (local_48 == local_40) {
                    plVar8 = local_40;
                    if (((options & 0x18U) == 0) ||
                       (lVar20 = LYXP_NODE_ROOT_CONFIG,
                       ((ulong)*(lyd_node **)&local_50->flags & 1) == 0)) {
                      lVar20 = LYXP_NODE_ROOT;
                    }
                  }
                  else {
                    lVar20 = LYXP_NODE_ELEM;
                    if (plVar8 == (lys_module *)0x0) {
                      if (((options & 0x18U) == 0) ||
                         (uVar16 = 1, ((ulong)*(lyd_node **)&local_50->flags & 1) == 0)) {
                        uVar16 = 0;
                      }
                      local_68 = (lys_module *)CONCAT44(local_68._4_4_,uVar16);
                      plVar8 = lys_node_module((lys_node *)local_40);
                      plVar8 = (lys_module *)lys_getnext((lys_node *)0x0,(lys_node *)0x0,plVar8,0);
                      if (plVar8 != local_48) {
                        pLVar15 = ly_errno_location();
                        *pLVar15 = LY_EINT;
                        ly_log(LY_LLERR,"Internal error (%s:%d).",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                               ,0x153c);
                      }
                      plVar8 = local_48;
                      lVar20 = (lyxp_node_type)local_68;
                    }
                  }
                  if ((lVar20 != LYXP_NODE_ELEM) && ((lVar20 != local_94 || (plVar8 != local_48))))
                  {
                    __assert_fail("(new_type == LYXP_NODE_ELEM) || ((new_type == root_type) && (new_node == root))"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                                  ,0x1546,
                                  "int moveto_snode_parent(struct lyxp_set *, struct lys_node *, int, int)"
                                 );
                  }
                  iVar17 = set_snode_insert_node(set,(lys_node *)plVar8,lVar20);
                  plVar29 = local_58;
                  if ((long)plVar31 < (long)iVar17 && iVar17 < (int)local_58) {
                    (set->val).nodes[iVar17].pos = 2;
                    local_60 = (ly_ctx *)CONCAT44(local_60._4_4_,1);
                  }
                }
              }
              plVar31 = (ly_ctx *)((long)&(plVar31->dict).recs[0].next + 1);
            } while (plVar31 != plVar29);
            bVar32 = (uint)local_60 != 0;
          }
          if (bVar32 && 0 < (int)plVar29) {
            lVar18 = 0;
            do {
              if (*(int *)((long)&((set->val).nodes)->pos + lVar18) == 2) {
                *(undefined4 *)((long)&((set->val).nodes)->pos + lVar18) = 1;
              }
              lVar18 = lVar18 + 0x10;
            } while ((long)plVar29 * 0x10 != lVar18);
          }
        }
        goto switchD_0016c3cb_caseD_0;
      case LYXP_SET_BOOLEAN:
switchD_0016c3cb_caseD_3:
        pcVar11 = "boolean";
        break;
      case LYXP_SET_NUMBER:
switchD_0016c3cb_caseD_4:
        pcVar11 = "number";
        break;
      case LYXP_SET_STRING:
switchD_0016c3cb_caseD_5:
        pcVar11 = "string";
        break;
      default:
switchD_0016c3cb_default:
        pcVar11 = (char *)0x0;
      }
switchD_0016c3cb_caseD_2:
      ly_vlog(LYE_XPATH_INOP_1,LY_VLOG_NONE,(void *)0x0,"path operator",pcVar11);
LAB_0016cdab:
      lVar7 = ~LYXP_SET_EMPTY;
switchD_0016c3cb_caseD_0:
      if (lVar7 != LYXP_SET_EMPTY) {
        return lVar7;
      }
      if ('\x02' < ly_log_level) {
        pcVar11 = print_token(exp->tokens[*exp_idx]);
        ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_relative_location_path",local_90,pcVar11,
                   (ulong)exp->expr_pos[*exp_idx]);
      }
      *exp_idx = *exp_idx + 1;
      goto LAB_0016ce0f;
    case LYXP_TOKEN_AT:
      if ('\x02' < ly_log_level) {
        pcVar11 = print_token(exp->tokens[*exp_idx]);
        ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_relative_location_path",local_90,pcVar11,
                   (ulong)exp->expr_pos[*exp_idx]);
      }
      *exp_idx = *exp_idx + 1;
      bVar32 = false;
      break;
    default:
      pLVar15 = ly_errno_location();
      *pLVar15 = LY_EINT;
      ly_log(LY_LLERR,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c",
             0x17ee);
      return -1;
    case LYXP_TOKEN_NAMETEST:
    case LYXP_TOKEN_NODETYPE:
      bVar32 = true;
    }
    uVar6 = *exp_idx;
    if (exp->tokens[uVar6] != LYXP_TOKEN_NODETYPE) {
      if (exp->tokens[uVar6] != LYXP_TOKEN_NAMETEST) {
        pLVar15 = ly_errno_location();
        *pLVar15 = LY_EINT;
        ly_log(LY_LLERR,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
               ,0x16b0);
        goto LAB_0016c73f;
      }
      if (bVar32) {
        if (all_desc == 0) {
          if ((set == (lyxp_set *)0x0) || (set->type != LYXP_SET_SNODE_SET)) {
            lVar7 = moveto_node(set,(lyd_node *)local_50,exp->expr + exp->expr_pos[uVar6],
                                (ushort)exp->tok_len[uVar6],options);
          }
          else {
            lVar7 = moveto_snode(set,local_50,exp->expr + exp->expr_pos[uVar6],
                                 (ushort)exp->tok_len[uVar6],options);
          }
        }
        else {
          if (local_31 != '\0') {
            lVar7 = moveto_node_alldesc(set,(lyd_node *)local_50,exp->expr + exp->expr_pos[uVar6],
                                        (ushort)exp->tok_len[uVar6],options);
            goto LAB_0016d041;
          }
          lVar7 = set->type;
          pcVar11 = "node set";
          switch(lVar7) {
          case LYXP_SET_EMPTY:
            goto switchD_0016cb8f_caseD_0;
          case LYXP_SET_NODE_SET:
            break;
          case LYXP_SET_SNODE_SET:
            uVar2 = exp->expr_pos[uVar6];
            pcVar11 = exp->expr;
            local_40 = (lys_module *)(ulong)exp->tok_len[uVar6];
            local_58 = local_50->module->ctx;
            moveto_snode_get_root(local_50,options,&local_9c);
            local_48 = (lys_module *)CONCAT44(local_48._4_4_,(uint)(ushort)local_40);
            local_70 = pcVar11 + uVar2;
            iVar17 = options;
            lVar7 = moveto_snode(set,local_50,pcVar11 + uVar2,(ushort)local_40,options);
            plVar8 = local_40;
            pcVar11 = local_70;
            if (lVar7 != LYXP_SET_EMPTY) goto switchD_0016cb8f_caseD_0;
            pcVar12 = strnchr(local_70,0x3a,(uint)local_48);
            if (pcVar12 == (char *)0x0) {
              plVar10 = (lys_module *)0x0;
LAB_0016d5e2:
              local_68 = (lys_module *)CONCAT71(local_68._1_7_,1);
              if ((short)plVar8 == 1) {
                local_68 = (lys_module *)CONCAT71(local_68._1_7_,*pcVar11 != '*');
              }
              local_60 = (ly_ctx *)(long)(int)set->used;
              lVar7 = LYXP_SET_EMPTY;
              local_80 = plVar10;
              if (0 < (long)local_60) {
                plVar10 = (lys_module *)0x0;
                plVar29 = (ly_ctx *)0x0;
                local_88 = set;
                local_70 = pcVar11;
                do {
                  local_58 = plVar29;
                  local_48 = plVar10;
                  if ((local_88->val).nodes[(long)plVar29].pos == 1) {
                    plVar10 = (lys_module *)(local_88->val).nodes[(long)plVar29].node;
                    local_40 = plVar10;
                    plVar24 = local_80;
                    while (local_80 = plVar24, plVar10 != (lys_module *)0x0) {
                      plVar14 = plVar10;
                      if ((local_9c == LYXP_NODE_ROOT_CONFIG) && (((ulong)plVar10->dsc & 2) != 0))
                      goto LAB_0016d809;
                      LVar4 = *(LYS_NODE *)&plVar10->filepath;
                      if ((int)LVar4 < 0x400) {
                        if ((LVar4 != LYS_CHOICE) && (LVar4 != LYS_CASE)) {
                          if (LVar4 == LYS_INPUT) {
                            if ((options & 0x20U) != 0) goto LAB_0016d809;
                          }
                          else {
LAB_0016d6bb:
                            if (plVar24 == (lys_module *)0x0) {
                              bVar32 = true;
                            }
                            else {
                              plVar13 = lys_node_module((lys_node *)plVar10);
                              bVar32 = plVar13 == plVar24;
                            }
                            if ((char)local_68 != '\0') {
                              plVar29 = plVar10->ctx;
                              iVar17 = strncmp((char *)plVar29,local_70,(ulong)plVar8 & 0xffff);
                              if ((iVar17 != 0) ||
                                 (*(char *)((long)&(plVar29->dict).recs[0].next +
                                           ((ulong)plVar8 & 0xffff)) != '\0')) {
                                bVar32 = false;
                              }
                            }
                            if ((plVar10 == local_40) || (!bVar32)) {
                              if ((plVar10 == local_40) && (!bVar32)) {
                                pLVar15 = ly_errno_location();
                                *pLVar15 = LY_EINT;
                                ly_log(LY_LLERR,"Internal error (%s:%d).",
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                                       ,0x12eb);
                              }
                            }
                            else {
                              uVar28 = 0xffffffff;
                              if ((ulong)local_88->used != 0) {
                                plVar24 = (lys_module *)0x0;
                                uVar26 = 0;
                                do {
                                  if (((local_48 != plVar24) &&
                                      (*(lys_module **)
                                        ((long)&plVar24->ctx + (long)&((local_88->val).nodes)->node)
                                       == plVar10)) &&
                                     (uVar28 = uVar26,
                                     *(int *)((long)&((local_88->val).nodes)->type + (long)plVar24)
                                     == 2)) break;
                                  uVar26 = uVar26 + 1;
                                  plVar24 = (lys_module *)&plVar24->prefix;
                                  uVar28 = 0xffffffff;
                                } while ((lys_module *)((ulong)local_88->used << 4) != plVar24);
                              }
                              if ((int)uVar28 < 0) {
                                set_snode_insert_node(local_88,(lys_node *)plVar10,LYXP_NODE_ELEM);
                              }
                              else {
                                (local_88->val).nodes[(long)(ulong)uVar28].pos = 1;
                                if (local_58 < (ly_ctx *)(ulong)uVar28) goto LAB_0016d809;
                              }
                            }
                          }
                        }
LAB_0016d7f0:
                        if (((ulong)plVar10->filepath & 0x802c) == 0) {
                          plVar24 = *(lys_module **)&plVar10->augment_size;
                        }
                        else {
                          plVar24 = (lys_module *)0x0;
                        }
                        if (plVar24 == (lys_module *)0x0) goto LAB_0016d809;
                      }
                      else {
                        if (LVar4 == LYS_OUTPUT) {
                          if ((options & 0x20U) != 0) goto LAB_0016d7f0;
                        }
                        else if (LVar4 != LYS_GROUPING) {
                          if (LVar4 != LYS_USES) goto LAB_0016d6bb;
                          goto LAB_0016d7f0;
                        }
LAB_0016d809:
                        if (plVar10 == local_40) break;
                        plVar24 = (lys_module *)plVar10->rev;
                      }
                      while ((plVar10 = plVar24, plVar24 = local_80, plVar10 == (lys_module *)0x0 &&
                             (plVar13 = (lys_module *)lys_parent((lys_node *)plVar14),
                             plVar24 = local_80, plVar13 != local_40))) {
                        plVar14 = (lys_module *)lys_parent((lys_node *)plVar14);
                        plVar24 = (lys_module *)plVar14->rev;
                      }
                    }
                  }
                  plVar29 = (ly_ctx *)((long)&(local_58->dict).recs[0].next + 1);
                  plVar10 = (lys_module *)&local_48->prefix;
                  set = local_88;
                } while (plVar29 != local_60);
              }
              goto switchD_0016cb8f_caseD_0;
            }
            pcVar12 = strnchr(pcVar11,0x3a,(uint)local_48);
            uVar28 = (int)pcVar12 - (int)pcVar11;
            plVar10 = moveto_resolve_model(pcVar11,(uint16_t)uVar28,local_58,local_50,iVar17);
            if (plVar10 != (lys_module *)0x0) {
              pcVar11 = pcVar11 + (long)(int)uVar28 + 1;
              plVar8 = (lys_module *)(ulong)(~uVar28 + (uint)local_48);
              goto LAB_0016d5e2;
            }
            ly_vlog(LYE_XPATH_INMOD,LY_VLOG_NONE,(void *)0x0,(ulong)uVar28,pcVar11);
            goto LAB_0016d037;
          case LYXP_SET_BOOLEAN:
            pcVar11 = "boolean";
            break;
          case LYXP_SET_NUMBER:
            pcVar11 = "number";
            break;
          case LYXP_SET_STRING:
            pcVar11 = "string";
            break;
          default:
            pcVar11 = (char *)0x0;
          }
          ly_vlog(LYE_XPATH_INOP_1,LY_VLOG_NONE,(void *)0x0,"path operator",pcVar11);
LAB_0016d037:
          lVar7 = ~LYXP_SET_EMPTY;
switchD_0016cb8f_caseD_0:
        }
LAB_0016d041:
        if ((set != (lyxp_set *)0x0 && (options & 0x1cU) != 0) && lVar7 == LYXP_SET_EMPTY) {
          uVar28 = set->used;
          iVar17 = uVar28 - 1;
          if (-2 < iVar17) {
            iVar17 = -1;
          }
          iVar21 = uVar28 + 1;
          do {
            uVar28 = uVar28 - 1;
            iVar22 = iVar17 + 1;
            if ((int)uVar28 < 0) break;
            iVar21 = iVar21 + -1;
            iVar22 = iVar21;
          } while ((set->val).nodes[uVar28 & 0x7fffffff].pos == 0);
          lVar7 = LYXP_SET_EMPTY;
          if (iVar22 == 0) {
            ly_vlog(LYE_XPATH_INSNODE,LY_VLOG_NONE,(void *)0x0,(ulong)exp->tok_len[*exp_idx],
                    exp->expr + exp->expr_pos[*exp_idx],
                    (ulong)((uint)exp->expr_pos[*exp_idx] + (uint)exp->tok_len[*exp_idx]),exp->expr)
            ;
            goto LAB_0016c73f;
          }
        }
      }
      else if (local_31 == '\0') {
        uVar28 = set->used;
        lVar7 = LYXP_SET_EMPTY;
        if ((ulong)uVar28 != 0) {
          lVar18 = 0;
          do {
            if (*(int *)((long)&((set->val).nodes)->pos + lVar18) == 1) {
              *(undefined4 *)((long)&((set->val).nodes)->pos + lVar18) = 0;
            }
            lVar18 = lVar18 + 0x10;
          } while ((ulong)uVar28 << 4 != lVar18);
        }
      }
      else {
        if (all_desc == 0) {
          lVar7 = LYXP_SET_EMPTY;
          if (set != (lyxp_set *)0x0) {
            lVar7 = set->type;
            pcVar11 = "schema node set";
            switch(lVar7) {
            case LYXP_SET_EMPTY:
              break;
            case LYXP_SET_NODE_SET:
              local_48 = (lys_module *)(exp->expr + exp->expr_pos[uVar6]);
              uVar28 = (uint)exp->tok_len[uVar6];
              local_58 = (ly_ctx *)CONCAT44(local_58._4_4_,uVar28);
              pcVar12 = strnchr((char *)local_48,0x3a,uVar28);
              plVar8 = local_48;
              iVar17 = (int)pcVar11;
              if ((local_50 == (lys_node *)0x0) || (pcVar12 == (char *)0x0)) {
                local_40 = (lys_module *)0x0;
              }
              else {
                pcVar11 = strnchr((char *)local_48,0x3a,(lyxp_node_type)local_58);
                local_60 = (ly_ctx *)(pcVar11 + -(long)plVar8);
                local_40 = moveto_resolve_model
                                     ((char *)plVar8,(uint16_t)local_60,
                                      ((lys_node *)local_50->name)->module->ctx,(lys_node *)0x0,
                                      iVar17);
                if (local_40 == (lys_module *)0x0) {
                  pLVar15 = ly_errno_location();
                  *pLVar15 = LY_EINT;
                  uVar19 = 0x1331;
                  goto LAB_0016d8c6;
                }
                uVar28 = ~(uint)local_60 + (lyxp_node_type)local_58;
                plVar8 = (lys_module *)((long)&local_48->ctx + (long)(int)(uint)local_60 + 1);
              }
              local_58 = (ly_ctx *)CONCAT71(local_58._1_7_,1);
              if ((short)uVar28 == 1) {
                local_58 = (ly_ctx *)CONCAT71(local_58._1_7_,*(char *)&plVar8->ctx != '*');
              }
              lVar7 = LYXP_SET_EMPTY;
              if (set->used != 0) {
                local_70 = (char *)(ulong)(uVar28 & 0xffff);
                plVar29 = (ly_ctx *)0x0;
                local_48 = plVar8;
                do {
                  bVar32 = true;
                  if ((((set->val).nodes[(ulong)plVar29 & 0xffffffff].type == LYXP_NODE_ELEM) &&
                      (plVar5 = (set->val).nodes[(ulong)plVar29 & 0xffffffff].node,
                      -1 < (char)plVar5->validity)) &&
                     (plVar30 = plVar5->attr, plVar30 != (lyd_attr *)0x0)) {
                    iVar17 = 0;
                    plVar10 = local_40;
                    do {
                      pcVar11 = local_70;
                      if ((plVar10 == (lys_module *)0x0) || (plVar30->annotation->module == plVar10)
                         ) {
                        if ((char)local_58 != '\0') {
                          local_68 = (lys_module *)CONCAT44(local_68._4_4_,iVar17);
                          local_80 = (lys_module *)plVar30->name;
                          local_60 = plVar29;
                          iVar21 = strncmp((char *)local_80,(char *)plVar8,(size_t)local_70);
                          plVar10 = local_40;
                          plVar29 = local_60;
                          plVar8 = local_48;
                          iVar17 = (lyxp_node_type)local_68;
                          if ((iVar21 != 0) || (pcVar11[(long)&local_80->ctx] != '\0'))
                          goto LAB_0016d401;
                        }
                        uVar27 = (ulong)plVar29 & 0xffffffff;
                        if (iVar17 == 0) {
                          (set->val).nodes[uVar27].node = (lyd_node *)plVar30;
                          (set->val).nodes[uVar27].type = LYXP_NODE_ATTR;
                        }
                        else {
                          set_insert_node(set,plVar30,(set->val).nodes[uVar27].pos,LYXP_NODE_ATTR,
                                          (int)plVar29 + 1);
                          plVar10 = local_40;
                          plVar8 = local_48;
                        }
                        plVar29 = (ly_ctx *)(ulong)((int)plVar29 + 1);
                        iVar17 = 1;
                      }
LAB_0016d401:
                      plVar30 = plVar30->next;
                    } while (plVar30 != (lyd_attr *)0x0);
                    bVar32 = iVar17 == 0;
                  }
                  if (bVar32) {
                    set_remove_node(set,(uint32_t)plVar29);
                    plVar8 = local_48;
                  }
                  lVar7 = LYXP_SET_EMPTY;
                } while ((uint32_t)plVar29 < set->used);
              }
              break;
            case LYXP_SET_SNODE_SET:
              goto switchD_0016c78f_caseD_2;
            case LYXP_SET_BOOLEAN:
              goto switchD_0016c78f_caseD_3;
            case LYXP_SET_NUMBER:
              goto switchD_0016c78f_caseD_4;
            case LYXP_SET_STRING:
              goto switchD_0016c78f_caseD_5;
            default:
              goto switchD_0016c78f_default;
            }
          }
          goto switchD_0016c78f_caseD_0;
        }
        lVar7 = LYXP_SET_EMPTY;
        if (set == (lyxp_set *)0x0) goto switchD_0016c78f_caseD_0;
        pcVar11 = "schema node set";
        lVar7 = set->type;
        switch(set->type) {
        case LYXP_SET_EMPTY:
          goto switchD_0016c78f_caseD_0;
        case LYXP_SET_NODE_SET:
          plVar29 = (ly_ctx *)(exp->expr + exp->expr_pos[uVar6]);
          bVar1 = exp->tok_len[uVar6];
          local_40 = (lys_module *)CONCAT44(local_40._4_4_,(uint)bVar1);
          pcVar12 = strnchr((char *)plVar29,0x3a,(uint)bVar1);
          iVar17 = (int)pcVar11;
          if (pcVar12 == (char *)0x0) {
            local_68 = (lys_module *)0x0;
            local_60 = plVar29;
            local_48 = (lys_module *)(ulong)bVar1;
LAB_0016d28f:
            set_00 = set_copy(set);
            lVar7 = moveto_node_alldesc(set_00,(lyd_node *)local_50,"*",1,options);
            if (lVar7 == LYXP_SET_EMPTY) {
              iVar17 = moveto_union(set,set_00,(lyd_node *)local_50,options);
              local_40 = (lys_module *)CONCAT44(local_40._4_4_,iVar17);
              lyxp_set_free(set_00);
              lVar7 = ~LYXP_SET_EMPTY;
              if ((uint32_t)local_40 == 0) {
                local_40 = (lys_module *)CONCAT71(local_40._1_7_,1);
                if ((short)local_48 == 1) {
                  local_40 = (lys_module *)
                             CONCAT71(local_40._1_7_,*(char *)&(local_60->dict).recs[0].next != '*')
                  ;
                }
                lVar7 = LYXP_SET_EMPTY;
                if (set->used != 0) {
                  local_70 = (char *)((ulong)local_48 & 0xffff);
                  plVar8 = (lys_module *)0x0;
                  plVar10 = local_68;
                  do {
                    bVar32 = true;
                    if (((set->val).nodes[(ulong)plVar8 & 0xffffffff].type == LYXP_NODE_ELEM) &&
                       (plVar30 = ((set->val).nodes[(ulong)plVar8 & 0xffffffff].node)->attr,
                       plVar30 != (lyd_attr *)0x0)) {
                      iVar17 = 0;
                      plVar29 = local_60;
                      do {
                        pcVar11 = local_70;
                        if ((plVar10 == (lys_module *)0x0) ||
                           (plVar30->annotation->module == plVar10)) {
                          if ((char)local_40 != '\0') {
                            local_58 = (ly_ctx *)CONCAT44(local_58._4_4_,iVar17);
                            local_80 = (lys_module *)plVar30->name;
                            local_48 = plVar8;
                            iVar21 = strncmp((char *)local_80,(char *)plVar29,(size_t)local_70);
                            plVar29 = local_60;
                            plVar8 = local_48;
                            plVar10 = local_68;
                            iVar17 = (lyxp_node_type)local_58;
                            if ((iVar21 != 0) || (pcVar11[(long)&local_80->ctx] != '\0'))
                            goto LAB_0016d582;
                          }
                          uVar27 = (ulong)plVar8 & 0xffffffff;
                          if (iVar17 == 0) {
                            (set->val).nodes[uVar27].node = (lyd_node *)plVar30;
                            (set->val).nodes[uVar27].type = LYXP_NODE_ATTR;
                          }
                          else {
                            set_insert_node(set,plVar30,(set->val).nodes[uVar27].pos,LYXP_NODE_ATTR,
                                            (int)plVar8 + 1);
                            plVar29 = local_60;
                            plVar10 = local_68;
                          }
                          plVar8 = (lys_module *)(ulong)((int)plVar8 + 1);
                          iVar17 = 1;
                        }
LAB_0016d582:
                        plVar30 = plVar30->next;
                      } while (plVar30 != (lyd_attr *)0x0);
                      bVar32 = iVar17 == 0;
                    }
                    if (bVar32) {
                      set_remove_node(set,(uint32_t)plVar8);
                    }
                    lVar7 = LYXP_SET_EMPTY;
                  } while ((uint32_t)plVar8 < set->used);
                }
              }
            }
            else {
              lyxp_set_free(set_00);
            }
            goto switchD_0016c78f_caseD_0;
          }
          pcVar11 = strnchr((char *)plVar29,0x3a,(uint32_t)local_40);
          local_68 = moveto_resolve_model
                               ((char *)plVar29,(uint16_t)((long)pcVar11 - (long)plVar29),
                                ((lys_node *)local_50->name)->module->ctx,(lys_node *)0x0,iVar17);
          if (local_68 != (lys_module *)0x0) {
            uVar28 = (uint)((long)pcVar11 - (long)plVar29);
            local_60 = (ly_ctx *)((long)&(plVar29->dict).recs[0].next + (long)(int)uVar28 + 1);
            local_48 = (lys_module *)(ulong)(~uVar28 + (uint32_t)local_40);
            goto LAB_0016d28f;
          }
          pLVar15 = ly_errno_location();
          *pLVar15 = LY_EINT;
          uVar19 = 0x13b8;
LAB_0016d8c6:
          ly_log(LY_LLERR,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                 ,uVar19);
          goto LAB_0016d0f6;
        case LYXP_SET_SNODE_SET:
          break;
        case LYXP_SET_BOOLEAN:
switchD_0016c78f_caseD_3:
          pcVar11 = "boolean";
          break;
        case LYXP_SET_NUMBER:
switchD_0016c78f_caseD_4:
          pcVar11 = "number";
          break;
        case LYXP_SET_STRING:
switchD_0016c78f_caseD_5:
          pcVar11 = "string";
          break;
        default:
switchD_0016c78f_default:
          pcVar11 = (char *)0x0;
        }
switchD_0016c78f_caseD_2:
        ly_vlog(LYE_XPATH_INOP_1,LY_VLOG_NONE,(void *)0x0,"path operator",pcVar11);
LAB_0016d0f6:
        lVar7 = ~LYXP_SET_EMPTY;
      }
switchD_0016c78f_caseD_0:
      plVar8 = local_78;
      if (lVar7 == LYXP_SET_EMPTY) {
        if ('\x02' < ly_log_level) {
          uVar6 = *exp_idx;
          pcVar11 = local_90;
          goto LAB_0016d11e;
        }
        goto LAB_0016d15b;
      }
      goto joined_r0x0016d166;
    }
    pcVar11 = "skipped";
    if (set == (lyxp_set *)0x0) break;
    if (exp->tok_len[uVar6] != '\x04') {
      __assert_fail("exp->tok_len[*exp_idx] == 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                    ,0x168e,
                    "int eval_node_test(struct lyxp_expr *, uint16_t *, struct lyd_node *, struct lys_module *, int, int, struct lyxp_set *, int)"
                   );
    }
    lVar7 = set->type;
    if (lVar7 == LYXP_SET_SNODE_SET) {
      uVar28 = set->used;
      pcVar11 = "skipped";
      if ((ulong)uVar28 != 0) {
        lVar18 = 0;
        do {
          if (*(int *)((long)&((set->val).nodes)->pos + lVar18) == 1) {
            *(undefined4 *)((long)&((set->val).nodes)->pos + lVar18) = 0;
          }
          lVar18 = lVar18 + 0x10;
        } while ((ulong)uVar28 << 4 != lVar18);
        pcVar11 = "skipped";
      }
      break;
    }
    uVar6 = exp->expr_pos[uVar6];
    pcVar11 = exp->expr;
    iVar17 = strncmp(pcVar11 + uVar6,"node",4);
    if (iVar17 == 0) {
      pcVar11 = "parsed";
      if (lVar7 != LYXP_SET_NODE_SET) {
        lyxp_set_cast(set,LYXP_SET_EMPTY,(lyd_node *)local_50,local_78,options);
LAB_0016cca5:
        pcVar11 = "parsed";
      }
      break;
    }
    iVar17 = strncmp(pcVar11 + uVar6,"text",4);
    plVar8 = local_78;
    if (iVar17 != 0) {
      __assert_fail("!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], \"text\", 4)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                    ,0x1699,
                    "int eval_node_test(struct lyxp_expr *, uint16_t *, struct lyd_node *, struct lys_module *, int, int, struct lyxp_set *, int)"
                   );
    }
    pcVar12 = "schema node set";
    pcVar11 = "parsed";
    switch(lVar7) {
    case LYXP_SET_EMPTY:
      goto switchD_0016ca84_caseD_0;
    case LYXP_SET_NODE_SET:
      pcVar11 = "parsed";
      if (set->used != 0) {
        uVar27 = 0;
        do {
          lVar20 = (set->val).nodes[uVar27].type;
          if (lVar20 < (LYXP_NODE_ATTR|LYXP_NODE_ROOT_CONFIG)) {
            if (lVar20 == LYXP_NODE_ELEM) {
              plVar9 = (set->val).nodes + uVar27;
              plVar5 = plVar9->node;
              if ((char)plVar5->validity < '\0') {
                ly_vlog(LYE_XPATH_DUMMY,LY_VLOG_LYD,plVar5,plVar5->schema->name);
                lVar7 = ~LYXP_SET_EMPTY;
                goto joined_r0x0016d166;
              }
              if (((plVar5->schema->nodetype & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) &&
                 (plVar5->child != (lyd_node *)0x0)) {
                plVar9->type = LYXP_NODE_TEXT;
                uVar27 = (ulong)((uint32_t)uVar27 + 1);
                goto LAB_0016cac2;
              }
            }
            set_remove_node(set,(uint32_t)uVar27);
          }
LAB_0016cac2:
        } while ((uint)uVar27 < set->used);
        goto LAB_0016cca5;
      }
      goto switchD_0016ca84_caseD_0;
    case LYXP_SET_SNODE_SET:
      break;
    case LYXP_SET_BOOLEAN:
      pcVar12 = "boolean";
      break;
    case LYXP_SET_NUMBER:
      pcVar12 = "number";
      break;
    case LYXP_SET_STRING:
      pcVar12 = "string";
      break;
    default:
      pcVar12 = (char *)0x0;
    }
    ly_vlog(LYE_XPATH_INCTX,LY_VLOG_NONE,(void *)0x0,pcVar12,"text()");
LAB_0016c73f:
    lVar7 = ~LYXP_SET_EMPTY;
    plVar8 = local_78;
joined_r0x0016d166:
    while( true ) {
      if (lVar7 != LYXP_SET_EMPTY) {
        return lVar7;
      }
      if ((exp->used <= *exp_idx) || (exp->tokens[*exp_idx] != LYXP_TOKEN_BRACK1)) break;
      lVar7 = eval_predicate(exp,exp_idx,(lyd_node *)local_50,plVar8,set,options);
    }
LAB_0016ce0f:
    uVar6 = *exp_idx;
    if (exp->used <= uVar6) {
      return 0;
    }
    if (exp->tokens[uVar6] != LYXP_TOKEN_OPERATOR_PATH) {
      return 0;
    }
    all_desc = 0;
    if (exp->tok_len[uVar6] != '\x01') {
      if (exp->tok_len[uVar6] != '\x02') {
        __assert_fail("exp->tok_len[*exp_idx] == 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                      ,0x17b0,
                      "int eval_relative_location_path(struct lyxp_expr *, uint16_t *, struct lyd_node *, struct lys_module *, int, struct lyxp_set *, int)"
                     );
      }
      all_desc = 1;
    }
    if ('\x02' < ly_log_level) {
      pcVar11 = print_token(LYXP_TOKEN_OPERATOR_PATH);
      ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_relative_location_path",local_90,pcVar11,
                 (ulong)exp->expr_pos[*exp_idx]);
    }
    *exp_idx = *exp_idx + 1;
  } while( true );
switchD_0016ca84_caseD_0:
  if ('\x02' < ly_log_level) {
    pcVar12 = print_token(exp->tokens[*exp_idx]);
    ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_node_test",pcVar11,pcVar12,
               (ulong)exp->expr_pos[*exp_idx]);
  }
  plVar8 = local_78;
  uVar3 = *exp_idx;
  *exp_idx = uVar3 + 1;
  if ('\x02' < ly_log_level) {
    pcVar12 = print_token(exp->tokens[(ushort)(uVar3 + 1)]);
    ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_node_test",pcVar11,pcVar12,
               (ulong)exp->expr_pos[*exp_idx]);
  }
  uVar6 = *exp_idx + 1;
  *exp_idx = uVar6;
  if ('\x02' < ly_log_level) {
LAB_0016d11e:
    pcVar12 = print_token(exp->tokens[uVar6]);
    ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_node_test",pcVar11,pcVar12,
               (ulong)exp->expr_pos[*exp_idx]);
  }
LAB_0016d15b:
  *exp_idx = *exp_idx + 1;
  lVar7 = LYXP_SET_EMPTY;
  goto joined_r0x0016d166;
}

Assistant:

static int
eval_relative_location_path(struct lyxp_expr *exp, uint16_t *exp_idx, struct lyd_node *cur_node, struct lys_module *local_mod,
                            int all_desc, struct lyxp_set *set, int options)
{
    int attr_axis, ret;

    goto step;
    do {
        /* evaluate '/' or '//' */
        if (exp->tok_len[*exp_idx] == 1) {
            all_desc = 0;
        } else {
            assert(exp->tok_len[*exp_idx] == 2);
            all_desc = 1;
        }
        LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
        ++(*exp_idx);

step:
        /* Step */
        attr_axis = 0;
        switch (exp->tokens[*exp_idx]) {
        case LYXP_TOKEN_DOT:
            /* evaluate '.' */
            if (set && (options & LYXP_SNODE_ALL)) {
                ret = moveto_snode_self(set, (struct lys_node *)cur_node, all_desc, options);
            } else {
                ret = moveto_self(set, cur_node, all_desc, options);
            }
            if (ret) {
                return ret;
            }
            LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
            ++(*exp_idx);
            break;
        case LYXP_TOKEN_DDOT:
            /* evaluate '..' */
            if (set && (options & LYXP_SNODE_ALL)) {
                ret = moveto_snode_parent(set, (struct lys_node *)cur_node, all_desc, options);
            } else {
                ret = moveto_parent(set, cur_node, all_desc, options);
            }
            if (ret) {
                return ret;
            }
            LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
            ++(*exp_idx);
            break;

        case LYXP_TOKEN_AT:
            /* evaluate '@' */
            attr_axis = 1;
            LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
            ++(*exp_idx);

            /* fall through */
        case LYXP_TOKEN_NAMETEST:
        case LYXP_TOKEN_NODETYPE:
            ret = eval_node_test(exp, exp_idx, cur_node, local_mod, attr_axis, all_desc, set, options);
            if (ret) {
                return ret;
            }
            while ((exp->used > *exp_idx) && (exp->tokens[*exp_idx] == LYXP_TOKEN_BRACK1)) {
                ret = eval_predicate(exp, exp_idx, cur_node, local_mod, set, options);
                if (ret) {
                    return ret;
                }
            }
            break;
        default:
            LOGINT;
            return -1;
        }
    } while ((exp->used > *exp_idx) && (exp->tokens[*exp_idx] == LYXP_TOKEN_OPERATOR_PATH));

    return EXIT_SUCCESS;
}